

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generate_code.cc
# Opt level: O0

void __thiscall
re2c::Skeleton::emit_start
          (Skeleton *this,OutputFile *o,size_t maxfill,bool backup,bool backupctx,bool accept)

{
  char *pcVar1;
  size_t o_00;
  uint32_t uVar2;
  opt_t *poVar3;
  OutputFile *pOVar4;
  uint *puVar5;
  uint32_t local_9c;
  uint local_98;
  allocator<char> local_91;
  string local_90;
  allocator<char> local_59;
  string local_58;
  uint32_t local_38;
  uint32_t local_34;
  ulong uStack_30;
  uint32_t default_rule;
  size_t sizeof_cunit;
  bool accept_local;
  bool backupctx_local;
  size_t sStack_20;
  bool backup_local;
  size_t maxfill_local;
  OutputFile *o_local;
  Skeleton *this_local;
  
  sizeof_cunit._5_1_ = accept;
  sizeof_cunit._6_1_ = backupctx;
  sizeof_cunit._7_1_ = backup;
  sStack_20 = maxfill;
  maxfill_local = (size_t)o;
  o_local = (OutputFile *)this;
  poVar3 = Opt::operator->((Opt *)&opts);
  uVar2 = Enc::szCodeUnit(&poVar3->encoding);
  uStack_30 = (ulong)uVar2;
  local_38 = (uint32_t)rule_rank_t::none();
  local_34 = rule2key(this,(rule_rank_t)local_38);
  OutputFile::ws((OutputFile *)maxfill_local,"\n#define YYCTYPE ");
  exact_uint((OutputFile *)maxfill_local,uStack_30);
  OutputFile::ws((OutputFile *)maxfill_local,"\n#define YYKEYTYPE ");
  exact_uint((OutputFile *)maxfill_local,this->sizeof_key);
  OutputFile::ws((OutputFile *)maxfill_local,"\n#define YYPEEK() *cursor");
  OutputFile::ws((OutputFile *)maxfill_local,"\n#define YYSKIP() ++cursor");
  if ((sizeof_cunit._7_1_ & 1) != 0) {
    OutputFile::ws((OutputFile *)maxfill_local,"\n#define YYBACKUP() marker = cursor");
    OutputFile::ws((OutputFile *)maxfill_local,"\n#define YYRESTORE() cursor = marker");
  }
  if ((sizeof_cunit._6_1_ & 1) != 0) {
    OutputFile::ws((OutputFile *)maxfill_local,"\n#define YYBACKUPCTX() ctxmarker = cursor");
    OutputFile::ws((OutputFile *)maxfill_local,"\n#define YYRESTORECTX() cursor = ctxmarker");
  }
  OutputFile::ws((OutputFile *)maxfill_local,"\n#define YYLESSTHAN(n) (limit - cursor) < n");
  OutputFile::ws((OutputFile *)maxfill_local,"\n#define YYFILL(n) { break; }");
  OutputFile::ws((OutputFile *)maxfill_local,"\n");
  pOVar4 = OutputFile::ws((OutputFile *)maxfill_local,"\nstatic int action_");
  OutputFile::wstring(pOVar4,&this->name);
  pOVar4 = OutputFile::ws((OutputFile *)maxfill_local,"\n");
  pOVar4 = OutputFile::wind(pOVar4,1);
  OutputFile::ws(pOVar4,"( unsigned int i");
  pOVar4 = OutputFile::ws((OutputFile *)maxfill_local,"\n");
  pOVar4 = OutputFile::wind(pOVar4,1);
  OutputFile::ws(pOVar4,", const YYKEYTYPE *keys");
  pOVar4 = OutputFile::ws((OutputFile *)maxfill_local,"\n");
  pOVar4 = OutputFile::wind(pOVar4,1);
  OutputFile::ws(pOVar4,", const YYCTYPE *start");
  pOVar4 = OutputFile::ws((OutputFile *)maxfill_local,"\n");
  pOVar4 = OutputFile::wind(pOVar4,1);
  OutputFile::ws(pOVar4,", const YYCTYPE *token");
  pOVar4 = OutputFile::ws((OutputFile *)maxfill_local,"\n");
  pOVar4 = OutputFile::wind(pOVar4,1);
  OutputFile::ws(pOVar4,", const YYCTYPE **cursor");
  pOVar4 = OutputFile::ws((OutputFile *)maxfill_local,"\n");
  pOVar4 = OutputFile::wind(pOVar4,1);
  OutputFile::ws(pOVar4,", YYKEYTYPE rule_act");
  pOVar4 = OutputFile::ws((OutputFile *)maxfill_local,"\n");
  pOVar4 = OutputFile::wind(pOVar4,1);
  OutputFile::ws(pOVar4,")");
  OutputFile::ws((OutputFile *)maxfill_local,"\n{");
  pOVar4 = OutputFile::ws((OutputFile *)maxfill_local,"\n");
  pOVar4 = OutputFile::wind(pOVar4,1);
  OutputFile::ws(pOVar4,"const long pos = token - start;");
  pOVar4 = OutputFile::ws((OutputFile *)maxfill_local,"\n");
  pOVar4 = OutputFile::wind(pOVar4,1);
  OutputFile::ws(pOVar4,"const long len_act = *cursor - token;");
  pOVar4 = OutputFile::ws((OutputFile *)maxfill_local,"\n");
  pOVar4 = OutputFile::wind(pOVar4,1);
  OutputFile::ws(pOVar4,"const long len_exp = (long) keys [3 * i + 1];");
  pOVar4 = OutputFile::ws((OutputFile *)maxfill_local,"\n");
  pOVar4 = OutputFile::wind(pOVar4,1);
  OutputFile::ws(pOVar4,"const YYKEYTYPE rule_exp = keys [3 * i + 2];");
  pOVar4 = OutputFile::ws((OutputFile *)maxfill_local,"\n");
  pOVar4 = OutputFile::wind(pOVar4,1);
  pOVar4 = OutputFile::ws(pOVar4,"if (rule_exp == ");
  pOVar4 = OutputFile::wu32(pOVar4,local_34);
  OutputFile::ws(pOVar4,") {");
  pOVar4 = OutputFile::ws((OutputFile *)maxfill_local,"\n");
  pOVar4 = OutputFile::wind(pOVar4,2);
  OutputFile::ws(pOVar4,"fprintf");
  pOVar4 = OutputFile::ws((OutputFile *)maxfill_local,"\n");
  pOVar4 = OutputFile::wind(pOVar4,3);
  OutputFile::ws(pOVar4,"( stderr");
  pOVar4 = OutputFile::ws((OutputFile *)maxfill_local,"\n");
  pOVar4 = OutputFile::wind(pOVar4,3);
  pOVar4 = OutputFile::ws(pOVar4,", \"warning: lex_");
  pOVar4 = OutputFile::wstring(pOVar4,&this->name);
  OutputFile::ws(pOVar4,": control flow is undefined for input\"");
  pOVar4 = OutputFile::ws((OutputFile *)maxfill_local,"\n");
  pOVar4 = OutputFile::wind(pOVar4,4);
  OutputFile::ws(pOVar4,"\" at position %ld, rerun re2c with \'-W\'\\n\"");
  pOVar4 = OutputFile::ws((OutputFile *)maxfill_local,"\n");
  pOVar4 = OutputFile::wind(pOVar4,3);
  OutputFile::ws(pOVar4,", pos");
  pOVar4 = OutputFile::ws((OutputFile *)maxfill_local,"\n");
  pOVar4 = OutputFile::wind(pOVar4,3);
  OutputFile::ws(pOVar4,");");
  pOVar4 = OutputFile::ws((OutputFile *)maxfill_local,"\n");
  pOVar4 = OutputFile::wind(pOVar4,1);
  OutputFile::ws(pOVar4,"}");
  pOVar4 = OutputFile::ws((OutputFile *)maxfill_local,"\n");
  pOVar4 = OutputFile::wind(pOVar4,1);
  OutputFile::ws(pOVar4,"if (len_act == len_exp && rule_act == rule_exp) {");
  pOVar4 = OutputFile::ws((OutputFile *)maxfill_local,"\n");
  pOVar4 = OutputFile::wind(pOVar4,2);
  OutputFile::ws(pOVar4,"const YYKEYTYPE offset = keys[3 * i];");
  pOVar4 = OutputFile::ws((OutputFile *)maxfill_local,"\n");
  pOVar4 = OutputFile::wind(pOVar4,2);
  OutputFile::ws(pOVar4,"*cursor = token + offset;");
  pOVar4 = OutputFile::ws((OutputFile *)maxfill_local,"\n");
  pOVar4 = OutputFile::wind(pOVar4,2);
  OutputFile::ws(pOVar4,"return 0;");
  pOVar4 = OutputFile::ws((OutputFile *)maxfill_local,"\n");
  pOVar4 = OutputFile::wind(pOVar4,1);
  OutputFile::ws(pOVar4,"} else {");
  pOVar4 = OutputFile::ws((OutputFile *)maxfill_local,"\n");
  pOVar4 = OutputFile::wind(pOVar4,2);
  OutputFile::ws(pOVar4,"fprintf");
  pOVar4 = OutputFile::ws((OutputFile *)maxfill_local,"\n");
  pOVar4 = OutputFile::wind(pOVar4,3);
  OutputFile::ws(pOVar4,"( stderr");
  pOVar4 = OutputFile::ws((OutputFile *)maxfill_local,"\n");
  pOVar4 = OutputFile::wind(pOVar4,3);
  pOVar4 = OutputFile::ws(pOVar4,", \"error: lex_");
  pOVar4 = OutputFile::wstring(pOVar4,&this->name);
  OutputFile::ws(pOVar4,": at position %ld (iteration %u):\\n\"");
  pOVar4 = OutputFile::ws((OutputFile *)maxfill_local,"\n");
  pOVar4 = OutputFile::wind(pOVar4,4);
  OutputFile::ws(pOVar4,"\"\\texpected: match length %ld, rule %u\\n\"");
  pOVar4 = OutputFile::ws((OutputFile *)maxfill_local,"\n");
  pOVar4 = OutputFile::wind(pOVar4,4);
  OutputFile::ws(pOVar4,"\"\\tactual:   match length %ld, rule %u\\n\"");
  pOVar4 = OutputFile::ws((OutputFile *)maxfill_local,"\n");
  pOVar4 = OutputFile::wind(pOVar4,3);
  OutputFile::ws(pOVar4,", pos");
  pOVar4 = OutputFile::ws((OutputFile *)maxfill_local,"\n");
  pOVar4 = OutputFile::wind(pOVar4,3);
  OutputFile::ws(pOVar4,", i");
  pOVar4 = OutputFile::ws((OutputFile *)maxfill_local,"\n");
  pOVar4 = OutputFile::wind(pOVar4,3);
  OutputFile::ws(pOVar4,", len_exp");
  pOVar4 = OutputFile::ws((OutputFile *)maxfill_local,"\n");
  pOVar4 = OutputFile::wind(pOVar4,3);
  OutputFile::ws(pOVar4,", rule_exp");
  pOVar4 = OutputFile::ws((OutputFile *)maxfill_local,"\n");
  pOVar4 = OutputFile::wind(pOVar4,3);
  OutputFile::ws(pOVar4,", len_act");
  pOVar4 = OutputFile::ws((OutputFile *)maxfill_local,"\n");
  pOVar4 = OutputFile::wind(pOVar4,3);
  OutputFile::ws(pOVar4,", rule_act");
  pOVar4 = OutputFile::ws((OutputFile *)maxfill_local,"\n");
  pOVar4 = OutputFile::wind(pOVar4,3);
  OutputFile::ws(pOVar4,");");
  pOVar4 = OutputFile::ws((OutputFile *)maxfill_local,"\n");
  pOVar4 = OutputFile::wind(pOVar4,2);
  OutputFile::ws(pOVar4,"return 1;");
  pOVar4 = OutputFile::ws((OutputFile *)maxfill_local,"\n");
  pOVar4 = OutputFile::wind(pOVar4,1);
  OutputFile::ws(pOVar4,"}");
  OutputFile::ws((OutputFile *)maxfill_local,"\n}");
  OutputFile::ws((OutputFile *)maxfill_local,"\n");
  pOVar4 = OutputFile::ws((OutputFile *)maxfill_local,"\nint lex_");
  pOVar4 = OutputFile::wstring(pOVar4,&this->name);
  OutputFile::ws(pOVar4,"()");
  OutputFile::ws((OutputFile *)maxfill_local,"\n{");
  pOVar4 = OutputFile::ws((OutputFile *)maxfill_local,"\n");
  pOVar4 = OutputFile::wind(pOVar4,1);
  pOVar4 = OutputFile::ws(pOVar4,"const size_t padding = ");
  pOVar4 = OutputFile::wu64(pOVar4,sStack_20);
  OutputFile::ws(pOVar4,"; /* YYMAXFILL */");
  pOVar4 = OutputFile::ws((OutputFile *)maxfill_local,"\n");
  pOVar4 = OutputFile::wind(pOVar4,1);
  OutputFile::ws(pOVar4,"int status = 0;");
  pOVar4 = OutputFile::ws((OutputFile *)maxfill_local,"\n");
  pOVar4 = OutputFile::wind(pOVar4,1);
  OutputFile::ws(pOVar4,"size_t input_len = 0;");
  pOVar4 = OutputFile::ws((OutputFile *)maxfill_local,"\n");
  pOVar4 = OutputFile::wind(pOVar4,1);
  OutputFile::ws(pOVar4,"size_t keys_count = 0;");
  pOVar4 = OutputFile::ws((OutputFile *)maxfill_local,"\n");
  pOVar4 = OutputFile::wind(pOVar4,1);
  OutputFile::ws(pOVar4,"YYCTYPE *input = NULL;");
  pOVar4 = OutputFile::ws((OutputFile *)maxfill_local,"\n");
  pOVar4 = OutputFile::wind(pOVar4,1);
  OutputFile::ws(pOVar4,"YYKEYTYPE *keys = NULL;");
  pOVar4 = OutputFile::ws((OutputFile *)maxfill_local,"\n");
  pOVar4 = OutputFile::wind(pOVar4,1);
  OutputFile::ws(pOVar4,"const YYCTYPE *cursor = NULL;");
  pOVar4 = OutputFile::ws((OutputFile *)maxfill_local,"\n");
  pOVar4 = OutputFile::wind(pOVar4,1);
  OutputFile::ws(pOVar4,"const YYCTYPE *limit = NULL;");
  pOVar4 = OutputFile::ws((OutputFile *)maxfill_local,"\n");
  pOVar4 = OutputFile::wind(pOVar4,1);
  OutputFile::ws(pOVar4,"const YYCTYPE *token = NULL;");
  pOVar4 = OutputFile::ws((OutputFile *)maxfill_local,"\n");
  pOVar4 = OutputFile::wind(pOVar4,1);
  OutputFile::ws(pOVar4,"const YYCTYPE *eof = NULL;");
  pOVar4 = OutputFile::ws((OutputFile *)maxfill_local,"\n");
  pOVar4 = OutputFile::wind(pOVar4,1);
  OutputFile::ws(pOVar4,"unsigned int i = 0;");
  OutputFile::ws((OutputFile *)maxfill_local,"\n");
  pOVar4 = OutputFile::ws((OutputFile *)maxfill_local,"\n");
  pOVar4 = OutputFile::wind(pOVar4,1);
  OutputFile::ws(pOVar4,"input = (YYCTYPE *) read_file");
  pOVar4 = OutputFile::ws((OutputFile *)maxfill_local,"\n");
  pOVar4 = OutputFile::wind(pOVar4,2);
  pOVar4 = OutputFile::ws(pOVar4,"(\"");
  pcVar1 = *(char **)maxfill_local;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_58,pcVar1,&local_59);
  pOVar4 = OutputFile::wstring(pOVar4,&local_58);
  pOVar4 = OutputFile::ws(pOVar4,".");
  pOVar4 = OutputFile::wstring(pOVar4,&this->name);
  OutputFile::ws(pOVar4,".input\"");
  std::__cxx11::string::~string((string *)&local_58);
  std::allocator<char>::~allocator(&local_59);
  pOVar4 = OutputFile::ws((OutputFile *)maxfill_local,"\n");
  pOVar4 = OutputFile::wind(pOVar4,2);
  OutputFile::ws(pOVar4,", sizeof (YYCTYPE)");
  pOVar4 = OutputFile::ws((OutputFile *)maxfill_local,"\n");
  pOVar4 = OutputFile::wind(pOVar4,2);
  OutputFile::ws(pOVar4,", padding");
  pOVar4 = OutputFile::ws((OutputFile *)maxfill_local,"\n");
  pOVar4 = OutputFile::wind(pOVar4,2);
  OutputFile::ws(pOVar4,", &input_len");
  pOVar4 = OutputFile::ws((OutputFile *)maxfill_local,"\n");
  pOVar4 = OutputFile::wind(pOVar4,2);
  OutputFile::ws(pOVar4,");");
  pOVar4 = OutputFile::ws((OutputFile *)maxfill_local,"\n");
  pOVar4 = OutputFile::wind(pOVar4,1);
  OutputFile::ws(pOVar4,"if (input == NULL) {");
  pOVar4 = OutputFile::ws((OutputFile *)maxfill_local,"\n");
  pOVar4 = OutputFile::wind(pOVar4,2);
  OutputFile::ws(pOVar4,"status = 1;");
  pOVar4 = OutputFile::ws((OutputFile *)maxfill_local,"\n");
  pOVar4 = OutputFile::wind(pOVar4,2);
  OutputFile::ws(pOVar4,"goto end;");
  pOVar4 = OutputFile::ws((OutputFile *)maxfill_local,"\n");
  pOVar4 = OutputFile::wind(pOVar4,1);
  OutputFile::ws(pOVar4,"}");
  OutputFile::ws((OutputFile *)maxfill_local,"\n");
  if (1 < uStack_30) {
    pOVar4 = OutputFile::ws((OutputFile *)maxfill_local,"\n");
    pOVar4 = OutputFile::wind(pOVar4,1);
    OutputFile::ws(pOVar4,"for (i = 0; i < input_len; ++i) {");
    from_le((OutputFile *)maxfill_local,2,uStack_30,"input[i]");
    pOVar4 = OutputFile::ws((OutputFile *)maxfill_local,"\n");
    pOVar4 = OutputFile::wind(pOVar4,1);
    OutputFile::ws(pOVar4,"}");
    OutputFile::ws((OutputFile *)maxfill_local,"\n");
  }
  pOVar4 = OutputFile::ws((OutputFile *)maxfill_local,"\n");
  pOVar4 = OutputFile::wind(pOVar4,1);
  OutputFile::ws(pOVar4,"keys = (YYKEYTYPE *) read_file");
  pOVar4 = OutputFile::ws((OutputFile *)maxfill_local,"\n");
  pOVar4 = OutputFile::wind(pOVar4,2);
  pOVar4 = OutputFile::ws(pOVar4,"(\"");
  pcVar1 = *(char **)maxfill_local;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_90,pcVar1,&local_91);
  pOVar4 = OutputFile::wstring(pOVar4,&local_90);
  pOVar4 = OutputFile::ws(pOVar4,".");
  pOVar4 = OutputFile::wstring(pOVar4,&this->name);
  OutputFile::ws(pOVar4,".keys\"");
  std::__cxx11::string::~string((string *)&local_90);
  std::allocator<char>::~allocator(&local_91);
  pOVar4 = OutputFile::ws((OutputFile *)maxfill_local,"\n");
  pOVar4 = OutputFile::wind(pOVar4,2);
  OutputFile::ws(pOVar4,", 3 * sizeof (YYKEYTYPE)");
  pOVar4 = OutputFile::ws((OutputFile *)maxfill_local,"\n");
  pOVar4 = OutputFile::wind(pOVar4,2);
  OutputFile::ws(pOVar4,", 0");
  pOVar4 = OutputFile::ws((OutputFile *)maxfill_local,"\n");
  pOVar4 = OutputFile::wind(pOVar4,2);
  OutputFile::ws(pOVar4,", &keys_count");
  pOVar4 = OutputFile::ws((OutputFile *)maxfill_local,"\n");
  pOVar4 = OutputFile::wind(pOVar4,2);
  OutputFile::ws(pOVar4,");");
  pOVar4 = OutputFile::ws((OutputFile *)maxfill_local,"\n");
  pOVar4 = OutputFile::wind(pOVar4,1);
  OutputFile::ws(pOVar4,"if (keys == NULL) {");
  pOVar4 = OutputFile::ws((OutputFile *)maxfill_local,"\n");
  pOVar4 = OutputFile::wind(pOVar4,2);
  OutputFile::ws(pOVar4,"status = 1;");
  pOVar4 = OutputFile::ws((OutputFile *)maxfill_local,"\n");
  pOVar4 = OutputFile::wind(pOVar4,2);
  OutputFile::ws(pOVar4,"goto end;");
  pOVar4 = OutputFile::ws((OutputFile *)maxfill_local,"\n");
  pOVar4 = OutputFile::wind(pOVar4,1);
  OutputFile::ws(pOVar4,"}");
  OutputFile::ws((OutputFile *)maxfill_local,"\n");
  if (1 < this->sizeof_key) {
    pOVar4 = OutputFile::ws((OutputFile *)maxfill_local,"\n");
    pOVar4 = OutputFile::wind(pOVar4,1);
    OutputFile::ws(pOVar4,"for (i = 0; i < 3 * keys_count; ++i) {");
    from_le((OutputFile *)maxfill_local,2,this->sizeof_key,"keys[i]");
    pOVar4 = OutputFile::ws((OutputFile *)maxfill_local,"\n");
    pOVar4 = OutputFile::wind(pOVar4,1);
    OutputFile::ws(pOVar4,"}");
    OutputFile::ws((OutputFile *)maxfill_local,"\n");
  }
  pOVar4 = OutputFile::ws((OutputFile *)maxfill_local,"\n");
  pOVar4 = OutputFile::wind(pOVar4,1);
  OutputFile::ws(pOVar4,"cursor = input;");
  pOVar4 = OutputFile::ws((OutputFile *)maxfill_local,"\n");
  pOVar4 = OutputFile::wind(pOVar4,1);
  OutputFile::ws(pOVar4,"limit = input + input_len + padding;");
  pOVar4 = OutputFile::ws((OutputFile *)maxfill_local,"\n");
  pOVar4 = OutputFile::wind(pOVar4,1);
  OutputFile::ws(pOVar4,"eof = input + input_len;");
  OutputFile::ws((OutputFile *)maxfill_local,"\n");
  pOVar4 = OutputFile::ws((OutputFile *)maxfill_local,"\n");
  pOVar4 = OutputFile::wind(pOVar4,1);
  OutputFile::ws(pOVar4,"for (i = 0; status == 0 && i < keys_count; ++i) {");
  pOVar4 = OutputFile::ws((OutputFile *)maxfill_local,"\n");
  pOVar4 = OutputFile::wind(pOVar4,2);
  OutputFile::ws(pOVar4,"token = cursor;");
  if ((sizeof_cunit._7_1_ & 1) != 0) {
    pOVar4 = OutputFile::ws((OutputFile *)maxfill_local,"\n");
    pOVar4 = OutputFile::wind(pOVar4,2);
    OutputFile::ws(pOVar4,"const YYCTYPE *marker = NULL;");
  }
  if ((sizeof_cunit._6_1_ & 1) != 0) {
    pOVar4 = OutputFile::ws((OutputFile *)maxfill_local,"\n");
    pOVar4 = OutputFile::wind(pOVar4,2);
    OutputFile::ws(pOVar4,"const YYCTYPE *ctxmarker = NULL;");
  }
  pOVar4 = OutputFile::ws((OutputFile *)maxfill_local,"\n");
  pOVar4 = OutputFile::wind(pOVar4,2);
  OutputFile::ws(pOVar4,"YYCTYPE yych;");
  if ((sizeof_cunit._5_1_ & 1) != 0) {
    pOVar4 = OutputFile::ws((OutputFile *)maxfill_local,"\n");
    pOVar4 = OutputFile::wind(pOVar4,2);
    OutputFile::ws(pOVar4,"unsigned int yyaccept = 0;");
  }
  OutputFile::ws((OutputFile *)maxfill_local,"\n");
  poVar3 = Opt::operator->((Opt *)&opts);
  o_00 = maxfill_local;
  if (((poVar3->bFlag & 1U) != 0) && (BitMap::first != 0)) {
    local_98 = 0x100;
    poVar3 = Opt::operator->((Opt *)&opts);
    local_9c = Enc::nCodeUnits(&poVar3->encoding);
    puVar5 = std::min<unsigned_int>(&local_98,&local_9c);
    BitMap::gen((OutputFile *)o_00,2,0,*puVar5);
  }
  OutputFile::ws((OutputFile *)maxfill_local,"\n");
  return;
}

Assistant:

void Skeleton::emit_start
	( OutputFile & o
	, size_t maxfill
	, bool backup
	, bool backupctx
	, bool accept
	) const
{
	const size_t sizeof_cunit = opts->encoding.szCodeUnit();
	const uint32_t default_rule = rule2key (rule_rank_t::none ());

	o.ws("\n#define YYCTYPE ");
	exact_uint (o, sizeof_cunit);
	o.ws("\n#define YYKEYTYPE ");
	exact_uint (o, sizeof_key);
	o.ws("\n#define YYPEEK() *cursor");
	o.ws("\n#define YYSKIP() ++cursor");
	if (backup)
	{
		o.ws("\n#define YYBACKUP() marker = cursor");
		o.ws("\n#define YYRESTORE() cursor = marker");
	}
	if (backupctx)
	{
		o.ws("\n#define YYBACKUPCTX() ctxmarker = cursor");
		o.ws("\n#define YYRESTORECTX() cursor = ctxmarker");
	}
	o.ws("\n#define YYLESSTHAN(n) (limit - cursor) < n");
	o.ws("\n#define YYFILL(n) { break; }");
	o.ws("\n");
	o.ws("\nstatic int action_").wstring(name);
	o.ws("\n").wind(1).ws("( unsigned int i");
	o.ws("\n").wind(1).ws(", const YYKEYTYPE *keys");
	o.ws("\n").wind(1).ws(", const YYCTYPE *start");
	o.ws("\n").wind(1).ws(", const YYCTYPE *token");
	o.ws("\n").wind(1).ws(", const YYCTYPE **cursor");
	o.ws("\n").wind(1).ws(", YYKEYTYPE rule_act");
	o.ws("\n").wind(1).ws(")");
	o.ws("\n{");
	o.ws("\n").wind(1).ws("const long pos = token - start;");
	o.ws("\n").wind(1).ws("const long len_act = *cursor - token;");
	o.ws("\n").wind(1).ws("const long len_exp = (long) keys [3 * i + 1];");
	o.ws("\n").wind(1).ws("const YYKEYTYPE rule_exp = keys [3 * i + 2];");
	o.ws("\n").wind(1).ws("if (rule_exp == ").wu32(default_rule).ws(") {");
	o.ws("\n").wind(2).ws("fprintf");
	o.ws("\n").wind(3).ws("( stderr");
	o.ws("\n").wind(3).ws(", \"warning: lex_").wstring(name).ws(": control flow is undefined for input\"");
	o.ws("\n").wind(4).ws("\" at position %ld, rerun re2c with '-W'\\n\"");
	o.ws("\n").wind(3).ws(", pos");
	o.ws("\n").wind(3).ws(");");
	o.ws("\n").wind(1).ws("}");
	o.ws("\n").wind(1).ws("if (len_act == len_exp && rule_act == rule_exp) {");
	o.ws("\n").wind(2).ws("const YYKEYTYPE offset = keys[3 * i];");
	o.ws("\n").wind(2).ws("*cursor = token + offset;");
	o.ws("\n").wind(2).ws("return 0;");
	o.ws("\n").wind(1).ws("} else {");
	o.ws("\n").wind(2).ws("fprintf");
	o.ws("\n").wind(3).ws("( stderr");
	o.ws("\n").wind(3).ws(", \"error: lex_").wstring(name).ws(": at position %ld (iteration %u):\\n\"");
	o.ws("\n").wind(4).ws("\"\\texpected: match length %ld, rule %u\\n\"");
	o.ws("\n").wind(4).ws("\"\\tactual:   match length %ld, rule %u\\n\"");
	o.ws("\n").wind(3).ws(", pos");
	o.ws("\n").wind(3).ws(", i");
	o.ws("\n").wind(3).ws(", len_exp");
	o.ws("\n").wind(3).ws(", rule_exp");
	o.ws("\n").wind(3).ws(", len_act");
	o.ws("\n").wind(3).ws(", rule_act");
	o.ws("\n").wind(3).ws(");");
	o.ws("\n").wind(2).ws("return 1;");
	o.ws("\n").wind(1).ws("}");
	o.ws("\n}");
	o.ws("\n");
	o.ws("\nint lex_").wstring(name).ws("()");
	o.ws("\n{");
	o.ws("\n").wind(1).ws("const size_t padding = ").wu64(maxfill).ws("; /* YYMAXFILL */");
	o.ws("\n").wind(1).ws("int status = 0;");
	o.ws("\n").wind(1).ws("size_t input_len = 0;");
	o.ws("\n").wind(1).ws("size_t keys_count = 0;");
	o.ws("\n").wind(1).ws("YYCTYPE *input = NULL;");
	o.ws("\n").wind(1).ws("YYKEYTYPE *keys = NULL;");
	o.ws("\n").wind(1).ws("const YYCTYPE *cursor = NULL;");
	o.ws("\n").wind(1).ws("const YYCTYPE *limit = NULL;");
	o.ws("\n").wind(1).ws("const YYCTYPE *token = NULL;");
	o.ws("\n").wind(1).ws("const YYCTYPE *eof = NULL;");
	o.ws("\n").wind(1).ws("unsigned int i = 0;");
	o.ws("\n");
	o.ws("\n").wind(1).ws("input = (YYCTYPE *) read_file");
	o.ws("\n").wind(2).ws("(\"").wstring(o.file_name).ws(".").wstring(name).ws(".input\"");
	o.ws("\n").wind(2).ws(", sizeof (YYCTYPE)");
	o.ws("\n").wind(2).ws(", padding");
	o.ws("\n").wind(2).ws(", &input_len");
	o.ws("\n").wind(2).ws(");");
	o.ws("\n").wind(1).ws("if (input == NULL) {");
	o.ws("\n").wind(2).ws("status = 1;");
	o.ws("\n").wind(2).ws("goto end;");
	o.ws("\n").wind(1).ws("}");
	o.ws("\n");
	if (sizeof_cunit > 1)
	{
		o.ws("\n").wind(1).ws("for (i = 0; i < input_len; ++i) {");
		from_le(o, 2, sizeof_cunit, "input[i]");
		o.ws("\n").wind(1).ws("}");
		o.ws("\n");
	}
	o.ws("\n").wind(1).ws("keys = (YYKEYTYPE *) read_file");
	o.ws("\n").wind(2).ws("(\"").wstring(o.file_name).ws(".").wstring(name).ws(".keys\"");
	o.ws("\n").wind(2).ws(", 3 * sizeof (YYKEYTYPE)");
	o.ws("\n").wind(2).ws(", 0");
	o.ws("\n").wind(2).ws(", &keys_count");
	o.ws("\n").wind(2).ws(");");
	o.ws("\n").wind(1).ws("if (keys == NULL) {");
	o.ws("\n").wind(2).ws("status = 1;");
	o.ws("\n").wind(2).ws("goto end;");
	o.ws("\n").wind(1).ws("}");
	o.ws("\n");
	if (sizeof_key > 1)
	{
		o.ws("\n").wind(1).ws("for (i = 0; i < 3 * keys_count; ++i) {");
		from_le(o, 2, sizeof_key, "keys[i]");
		o.ws("\n").wind(1).ws("}");
		o.ws("\n");
	}
	o.ws("\n").wind(1).ws("cursor = input;");
	o.ws("\n").wind(1).ws("limit = input + input_len + padding;");
	o.ws("\n").wind(1).ws("eof = input + input_len;");
	o.ws("\n");
	o.ws("\n").wind(1).ws("for (i = 0; status == 0 && i < keys_count; ++i) {");
	o.ws("\n").wind(2).ws("token = cursor;");
	if (backup)
	{
		o.ws("\n").wind(2).ws("const YYCTYPE *marker = NULL;");
	}
	if (backupctx)
	{
		o.ws("\n").wind(2).ws("const YYCTYPE *ctxmarker = NULL;");
	}
	o.ws("\n").wind(2).ws("YYCTYPE yych;");
	if (accept)
	{
		o.ws("\n").wind(2).ws("unsigned int yyaccept = 0;");
	}
	o.ws("\n");
	if (opts->bFlag && BitMap::first)
	{
		BitMap::gen (o, 2, 0, std::min (0x100u, opts->encoding.nCodeUnits ()));
	}
	o.ws("\n");
}